

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmq_addon.hpp
# Opt level: O2

ssize_t __thiscall
zmq::multipart_t::send(multipart_t *this,int __fd,void *__buf,size_t __n,int __flags)

{
  deque<zmq::message_t,_std::allocator<zmq::message_t>_> *this_00;
  bool bVar1;
  bool bVar2;
  undefined7 uVar3;
  size_type sVar4;
  uint extraout_EDX;
  undefined4 in_register_00000034;
  undefined8 unaff_R14;
  undefined7 uVar5;
  message_t message;
  socket_base local_78;
  message_t local_70;
  
  local_78._handle = (void *)CONCAT44(in_register_00000034,__fd);
  this_00 = &this->m_parts;
  sVar4 = std::deque<zmq::message_t,_std::allocator<zmq::message_t>_>::size(this_00);
  bVar2 = sVar4 != 0;
  uVar3 = (int7)((ulong)unaff_R14 >> 8);
  do {
    uVar5 = uVar3;
    bVar1 = bVar2;
    if (!bVar1) {
      std::deque<zmq::message_t,_std::allocator<zmq::message_t>_>::clear(this_00);
      break;
    }
    pop(&local_70,this);
    sVar4 = std::deque<zmq::message_t,_std::allocator<zmq::message_t>_>::size(this_00);
    detail::socket_base::send
              (&local_78,(int)&local_70,
               (void *)(ulong)(((uint)__buf & 0xfffffffd) + (uint)(sVar4 != 0) * 2),__n,__flags);
    message_t::~message_t(&local_70);
    bVar2 = sVar4 != 0;
    uVar3 = 0;
  } while ((extraout_EDX & 1) != 0);
  return CONCAT71(uVar5,~bVar1) & 0xffffff01;
}

Assistant:

bool send(socket_ref socket, int flags = 0)
    {
        flags &= ~(ZMQ_SNDMORE);
        bool more = size() > 0;
        while (more) {
            message_t message = pop();
            more = size() > 0;
#ifdef ZMQ_CPP11
            if (!socket.send(message, static_cast<send_flags>(
                                        (more ? ZMQ_SNDMORE : 0) | flags)))
                return false;
#else
            if (!socket.send(message, (more ? ZMQ_SNDMORE : 0) | flags))
                return false;
#endif
        }
        clear();
        return true;
    }